

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayoutDefault::write(DomLayoutDefault *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QString *pQVar3;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffeb8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffec0;
  QString *in_stack_fffffffffffffec8;
  QString *str_00;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar3 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar3;
  bVar1 = QString::isEmpty((QString *)0x1a1bc9);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"layoutdefault",0xd);
    QString::QString((QString *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffeb8);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a1c7c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffec0);
  }
  bVar1 = hasAttributeSpacing(this);
  if (bVar1) {
    in_stack_fffffffffffffec8 = pQVar3;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    iVar2 = attributeSpacing(this);
    QString::number((int)local_98,iVar2);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffec8,local_58);
    QString::~QString((QString *)0x1a1d47);
    QString::~QString((QString *)0x1a1d54);
  }
  bVar1 = hasAttributeMargin(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    iVar2 = attributeMargin(this);
    QString::number((int)local_e8,iVar2);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar3,local_a8);
    QString::~QString((QString *)0x1a1dfa);
    QString::~QString((QString *)0x1a1e07);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutDefault::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutdefault") : tagName.toLower());

    if (hasAttributeSpacing())
        writer.writeAttribute(u"spacing"_s, QString::number(attributeSpacing()));

    if (hasAttributeMargin())
        writer.writeAttribute(u"margin"_s, QString::number(attributeMargin()));

    writer.writeEndElement();
}